

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner.c
# Opt level: O0

int yaml_parser_fetch_stream_end(yaml_parser_t *parser)

{
  void *__dest;
  int iVar1;
  undefined4 local_68 [2];
  yaml_token_t token;
  yaml_parser_t *parser_local;
  
  if ((parser->mark).column != 0) {
    (parser->mark).column = 0;
    (parser->mark).line = (parser->mark).line + 1;
  }
  token.end_mark.column = (size_t)parser;
  iVar1 = yaml_parser_unroll_indent(parser,-1);
  if (iVar1 == 0) {
    parser_local._4_4_ = 0;
  }
  else {
    iVar1 = yaml_parser_remove_simple_key((yaml_parser_t *)token.end_mark.column);
    if (iVar1 == 0) {
      parser_local._4_4_ = 0;
    }
    else {
      *(undefined4 *)(token.end_mark.column + 0x154) = 0;
      memset(local_68,0,0x50);
      local_68[0] = 2;
      token.data._16_8_ = *(undefined8 *)(token.end_mark.column + 0xe0);
      token.start_mark.index = *(size_t *)(token.end_mark.column + 0xe8);
      token.start_mark.line = *(size_t *)(token.end_mark.column + 0xf0);
      token.start_mark.column = *(size_t *)(token.end_mark.column + 0xe0);
      token.end_mark.index = *(size_t *)(token.end_mark.column + 0xe8);
      token.end_mark.line = *(size_t *)(token.end_mark.column + 0xf0);
      if ((*(long *)(token.end_mark.column + 0x120) == *(long *)(token.end_mark.column + 0x110)) &&
         (iVar1 = yaml_queue_extend((void **)(token.end_mark.column + 0x108),
                                    (void **)(token.end_mark.column + 0x118),
                                    (void **)(token.end_mark.column + 0x120),
                                    (void **)(token.end_mark.column + 0x110)), iVar1 == 0)) {
        *(undefined4 *)token.end_mark.column = 1;
        parser_local._4_4_ = 0;
      }
      else {
        __dest = *(void **)(token.end_mark.column + 0x120);
        *(long *)(token.end_mark.column + 0x120) = (long)__dest + 0x50;
        memcpy(__dest,local_68,0x50);
        parser_local._4_4_ = 1;
      }
    }
  }
  return parser_local._4_4_;
}

Assistant:

static int
yaml_parser_fetch_stream_end(yaml_parser_t *parser)
{
    yaml_token_t token;

    /* Force new line. */

    if (parser->mark.column != 0) {
        parser->mark.column = 0;
        parser->mark.line ++;
    }

    /* Reset the indentation level. */

    if (!yaml_parser_unroll_indent(parser, -1))
        return 0;

    /* Reset simple keys. */

    if (!yaml_parser_remove_simple_key(parser))
        return 0;

    parser->simple_key_allowed = 0;

    /* Create the STREAM-END token and append it to the queue. */

    STREAM_END_TOKEN_INIT(token, parser->mark, parser->mark);

    if (!ENQUEUE(parser, parser->tokens, token))
        return 0;

    return 1;
}